

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::EraseImpl
          (KeyMapBase<unsigned_int> *this,map_index_t b,KeyNode *node,bool do_destroy)

{
  uint uVar1;
  NodeBase **v1;
  KeyNode<unsigned_int> **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  Arena *pAVar3;
  bool bVar4;
  NodeAndBucket NVar5;
  LogMessage local_78;
  Voidify local_61;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint local_50;
  NodeBase **local_48;
  NodeBase **prev;
  anon_class_24_3_6b4a2233 find_prev;
  NodeBase *pNStack_20;
  bool do_destroy_local;
  KeyNode *node_local;
  KeyMapBase<unsigned_int> *pKStack_10;
  map_index_t b_local;
  KeyMapBase<unsigned_int> *this_local;
  
  node_local._4_4_ = (this->super_UntypedMapBase).num_buckets_ - 1 & b;
  find_prev.this = (KeyMapBase<unsigned_int> *)((long)&node_local + 4);
  find_prev.b = (map_index_t *)&stack0xffffffffffffffe0;
  prev = (NodeBase **)this;
  find_prev.node._7_1_ = do_destroy;
  pNStack_20 = &node->super_NodeBase;
  pKStack_10 = this;
  local_48 = EraseImpl::anon_class_24_3_6b4a2233::operator()((anon_class_24_3_6b4a2233 *)&prev);
  if (*local_48 == (NodeBase *)0x0) {
    uVar1 = KeyNode<unsigned_int>::key((KeyNode<unsigned_int> *)pNStack_20);
    uVar1 = TransparentSupport<unsigned_int>::ToView(uVar1);
    NVar5 = FindHelper(this,uVar1);
    absl_log_internal_check_op_result = (Nullable<const_char_*>)NVar5.node;
    local_50 = NVar5.bucket;
    node_local._4_4_ = local_50;
    local_48 = EraseImpl::anon_class_24_3_6b4a2233::operator()((anon_class_24_3_6b4a2233 *)&prev);
  }
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::NodeBase*>(local_48);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::KeyNode<unsigned_int>*>
                 ((KeyNode<unsigned_int> **)&stack0xffffffffffffffe0);
  local_60 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::NodeBase*,google::protobuf::internal::KeyNode<unsigned_int>*>
                       (v1,v2,"*prev == node");
  if (local_60 == (Nullable<const_char_*>)0x0) {
    *local_48 = (*local_48)->next;
    (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
    if (node_local._4_4_ == (this->super_UntypedMapBase).index_of_first_non_null_) {
      while( true ) {
        bVar4 = false;
        if ((this->super_UntypedMapBase).index_of_first_non_null_ <
            (this->super_UntypedMapBase).num_buckets_) {
          bVar4 = (this->super_UntypedMapBase).table_
                  [(this->super_UntypedMapBase).index_of_first_non_null_] == (NodeBase *)0x0;
        }
        if (!bVar4) break;
        (this->super_UntypedMapBase).index_of_first_non_null_ =
             (this->super_UntypedMapBase).index_of_first_non_null_ + 1;
      }
    }
    pAVar3 = internal::UntypedMapBase::arena(&this->super_UntypedMapBase);
    if ((pAVar3 == (Arena *)0x0) && ((find_prev.node._7_1_ & 1) != 0)) {
      internal::UntypedMapBase::DeleteNode(&this->super_UntypedMapBase,pNStack_20);
    }
    return 1;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x2d4,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

PROTOBUF_NOINLINE size_type EraseImpl(map_index_t b, KeyNode* node,
                                        bool do_destroy) {
    // Force bucket_index to be in range.
    b &= (num_buckets_ - 1);

    const auto find_prev = [&] {
      NodeBase** prev = table_ + b;
      for (; *prev != nullptr && *prev != node; prev = &(*prev)->next) {
      }
      return prev;
    };

    NodeBase** prev = find_prev();
    if (*prev == nullptr) {
      // The bucket index is wrong. The table was modified since the iterator
      // was made, so let's find the new bucket.
      b = FindHelper(TS::ToView(node->key())).bucket;
      prev = find_prev();
    }
    ABSL_DCHECK_EQ(*prev, node);
    *prev = (*prev)->next;

    --num_elements_;
    if (ABSL_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             table_[index_of_first_non_null_] == nullptr) {
        ++index_of_first_non_null_;
      }
    }

    if (arena() == nullptr && do_destroy) {
      DeleteNode(node);
    }

    // To allow for the other overload of EraseImpl to do a tail call.
    return 1;
  }